

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cipher.c
# Opt level: O0

int * mbedtls_cipher_list(void)

{
  int *local_18;
  int *type;
  mbedtls_cipher_definition_t *def;
  
  if (supported_init == 0) {
    type = (int *)mbedtls_cipher_definitions;
    local_18 = mbedtls_cipher_supported;
    while (*type != 0) {
      *local_18 = *type;
      local_18 = local_18 + 1;
      type = type + 4;
    }
    *local_18 = 0;
    supported_init = 1;
  }
  return mbedtls_cipher_supported;
}

Assistant:

const int *mbedtls_cipher_list( void )
{
    const mbedtls_cipher_definition_t *def;
    int *type;

    if( ! supported_init )
    {
        def = mbedtls_cipher_definitions;
        type = mbedtls_cipher_supported;

        while( def->type != 0 )
            *type++ = (*def++).type;

        *type = 0;

        supported_init = 1;
    }

    return( mbedtls_cipher_supported );
}